

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grparser.c
# Opt level: O0

int ngp_include_file(char *fname)

{
  FILE *pFVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  char *saveptr;
  char envfiles [10000];
  char *envar;
  char *cp;
  char *p2;
  char *p;
  char *fname_local;
  
  if (fname == (char *)0x0) {
    fname_local._4_4_ = 0x16a;
  }
  else if (ngp_inclevel < 10) {
    pFVar1 = fopen(fname,"r");
    ngp_fp[ngp_inclevel] = (FILE *)pFVar1;
    if (pFVar1 == (FILE *)0x0) {
      envfiles._9992_8_ = getenv("CFITSIO_INCLUDE_FILES");
      if ((char *)envfiles._9992_8_ != (char *)0x0) {
        strncpy((char *)&saveptr,(char *)envfiles._9992_8_,9999);
        envfiles[0x2707] = '\0';
        cp = strtok((char *)&saveptr,":");
        while (cp != (char *)0x0) {
          sVar2 = strlen(fname);
          sVar3 = strlen(cp);
          pcVar4 = (char *)malloc(sVar2 + sVar3 + 2);
          if (pcVar4 == (char *)0x0) {
            return 0x168;
          }
          strcpy(pcVar4,cp);
          strcat(pcVar4,"/");
          strcat(pcVar4,fname);
          pFVar1 = fopen(pcVar4,"r");
          ngp_fp[ngp_inclevel] = (FILE *)pFVar1;
          free(pcVar4);
          if (ngp_fp[ngp_inclevel] != (FILE *)0x0) break;
          cp = strtok((char *)0x0,":");
        }
      }
      if (ngp_fp[ngp_inclevel] == (FILE *)0x0) {
        if (*fname == '/') {
          return 0x16e;
        }
        if (ngp_master_dir[0] == '\0') {
          return 0x16e;
        }
        sVar2 = strlen(fname);
        sVar3 = strlen(ngp_master_dir);
        pcVar4 = (char *)malloc(sVar2 + sVar3 + 1);
        if (pcVar4 == (char *)0x0) {
          return 0x168;
        }
        strcpy(pcVar4,ngp_master_dir);
        strcat(pcVar4,fname);
        pFVar1 = fopen(pcVar4,"r");
        ngp_fp[ngp_inclevel] = (FILE *)pFVar1;
        free(pcVar4);
        if (ngp_fp[ngp_inclevel] == (FILE *)0x0) {
          return 0x16e;
        }
      }
    }
    ngp_inclevel = ngp_inclevel + 1;
    fname_local._4_4_ = 0;
  }
  else {
    fname_local._4_4_ = 0x16d;
  }
  return fname_local._4_4_;
}

Assistant:

int	ngp_include_file(char *fname)		/* try to open include file */
 { char *p, *p2, *cp, *envar, envfiles[NGP_MAX_ENVFILES];
   char *saveptr;

   if (NULL == fname) return(NGP_NUL_PTR);

   if (ngp_inclevel >= NGP_MAX_INCLUDE)		/* too many include files */
     return(NGP_INC_NESTING);

   if (NULL == (ngp_fp[ngp_inclevel] = fopen(fname, "r")))
     {                                          /* if simple open failed .. */
       envar = getenv("CFITSIO_INCLUDE_FILES");	/* scan env. variable, and retry to open */

       if (NULL != envar)			/* is env. variable defined ? */
         { strncpy(envfiles, envar, NGP_MAX_ENVFILES - 1);
           envfiles[NGP_MAX_ENVFILES - 1] = 0;	/* copy search path to local variable, env. is fragile */

           for (p2 = ffstrtok(envfiles, ":",&saveptr); NULL != p2; p2 = ffstrtok(NULL, ":",&saveptr))
            {
	      cp = (char *)ngp_alloc(strlen(fname) + strlen(p2) + 2);
	      if (NULL == cp) return(NGP_NO_MEMORY);

	      strcpy(cp, p2);
#ifdef  MSDOS
              strcat(cp, "\\");			/* abs. pathname for MSDOS */
               
#else
              strcat(cp, "/");			/* and for unix */
#endif
	      strcat(cp, fname);
	  
	      ngp_fp[ngp_inclevel] = fopen(cp, "r");
	      ngp_free(cp);

	      if (NULL != ngp_fp[ngp_inclevel]) break;
	    }
        }
                                      
       if (NULL == ngp_fp[ngp_inclevel])	/* finally try to open relative to top level */
         {
#ifdef  MSDOS
           if ('\\' == fname[0]) return(NGP_ERR_FOPEN); /* abs. pathname for MSDOS, does not support C:\\PATH */
#else
           if ('/' == fname[0]) return(NGP_ERR_FOPEN); /* and for unix */
#endif
           if (0 == ngp_master_dir[0]) return(NGP_ERR_FOPEN);

	   p = ngp_alloc(strlen(fname) + strlen(ngp_master_dir) + 1);
           if (NULL == p) return(NGP_NO_MEMORY);

           strcpy(p, ngp_master_dir);		/* construct composite pathname */
           strcat(p, fname);			/* comp = master + fname */

           ngp_fp[ngp_inclevel] = fopen(p, "r");/* try to open composite */
           ngp_free(p);				/* we don't need buffer anymore */

           if (NULL == ngp_fp[ngp_inclevel])
             return(NGP_ERR_FOPEN);		/* fail if error */
         }
     }

   ngp_inclevel++;
   return(NGP_OK);
 }